

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::find_data::got_write_token(find_data *this,node_id *n,string *write_token)

{
  dht_observer *pdVar1;
  uint uVar2;
  uint32_t uVar3;
  node *this_00;
  undefined8 uVar4;
  undefined8 uVar5;
  mapped_type *this_01;
  difference_type in_RCX;
  span<const_char> in;
  span<const_char> in_00;
  aux *local_88;
  char *local_80;
  string local_78;
  span<const_char> local_58;
  string local_48;
  dht_observer *local_28;
  dht_observer *logger;
  string *write_token_local;
  node_id *n_local;
  find_data *this_local;
  
  logger = (dht_observer *)write_token;
  write_token_local = (string *)n;
  n_local = (node_id *)this;
  this_00 = traversal_algorithm::get_node(&this->super_traversal_algorithm);
  local_28 = dht::node::observer(this_00);
  if ((local_28 != (dht_observer *)0x0) &&
     (uVar2 = (**(local_28->super_dht_logger)._vptr_dht_logger)(local_28,4), pdVar1 = local_28,
     (uVar2 & 1) != 0)) {
    uVar3 = traversal_algorithm::id(&this->super_traversal_algorithm);
    span<const_char>::span<char>(&local_58,write_token);
    in.m_len = in_RCX;
    in.m_ptr = (char *)local_58.m_len;
    libtorrent::aux::to_hex_abi_cxx11_(&local_48,(aux *)local_58.m_ptr,in);
    uVar4 = ::std::__cxx11::string::c_str();
    span<char_const>::span<libtorrent::digest32<160l>,char,void>
              ((span<char_const> *)&local_88,(digest32<160L> *)write_token_local);
    in_00.m_len = in_RCX;
    in_00.m_ptr = local_80;
    libtorrent::aux::to_hex_abi_cxx11_(&local_78,local_88,in_00);
    uVar5 = ::std::__cxx11::string::c_str();
    (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
              (pdVar1,4,"[%u] adding write token \'%s\' under id \'%s\'",(ulong)uVar3,uVar4,uVar5);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  this_01 = ::std::
            map<libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_write_tokens,(key_type *)write_token_local);
  ::std::__cxx11::string::operator=((string *)this_01,(string *)write_token);
  return;
}

Assistant:

void find_data::got_write_token(node_id const& n, std::string write_token)
{
#ifndef TORRENT_DISABLE_LOGGING
	auto* logger = get_node().observer();
	if (logger != nullptr && logger->should_log(dht_logger::traversal))
	{
		logger->log(dht_logger::traversal
			, "[%u] adding write token '%s' under id '%s'"
			, id(), aux::to_hex(write_token).c_str()
			, aux::to_hex(n).c_str());
	}
#endif
	m_write_tokens[n] = std::move(write_token);
}